

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamma.c
# Opt level: O1

void chart_ramp_array(nk_context *nk,nk_color color,int count,unsigned_short *values)

{
  int iVar1;
  nk_flags nVar2;
  undefined4 in_register_00000014;
  ulong uVar3;
  char buffer [1024];
  char acStack_438 [1032];
  
  iVar1 = nk_chart_begin_colored
                    (&glfw.ctx,NK_CHART_LINES,SUB84(nk,0),(nk_color)0xffffffff,(int)color,0.0,
                     65535.0);
  if (iVar1 != 0) {
    if (0 < (int)color) {
      uVar3 = 0;
      do {
        nVar2 = nk_chart_push_slot(&glfw.ctx,
                                   (float)*(ushort *)
                                           (CONCAT44(in_register_00000014,count) + uVar3 * 2),0);
        if (nVar2 != 0) {
          snprintf(acStack_438,0x400,"#%u: %u (%0.5f) ",
                   (double)((float)*(ushort *)(CONCAT44(in_register_00000014,count) + uVar3 * 2) /
                           65535.0),uVar3 & 0xffffffff);
          nk_tooltip(&glfw.ctx,acStack_438);
        }
        uVar3 = uVar3 + 1;
      } while ((uint)color != uVar3);
    }
    nk_chart_end(&glfw.ctx);
  }
  return;
}

Assistant:

static void chart_ramp_array(struct nk_context* nk,
                             struct nk_color color,
                             int count, unsigned short int* values)
{
    if (nk_chart_begin_colored(nk, NK_CHART_LINES,
                               color, nk_rgb(255, 255, 255),
                               count, 0, 65535))
    {
        int i;
        for (i = 0;  i < count;  i++)
        {
            char buffer[1024];
            if (nk_chart_push(nk, values[i]))
            {
                snprintf(buffer, sizeof(buffer), "#%u: %u (%0.5f) ",
                         i, values[i], values[i] / 65535.f);
                nk_tooltip(nk, buffer);
            }
        }

        nk_chart_end(nk);
    }
}